

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void kj::Path::evalPart(Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  Fault this;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  String *pSVar4;
  size_t in_RCX;
  ArrayPtr<const_char> value;
  String local_a0;
  String local_88;
  Fault local_70;
  Fault f_1;
  undefined1 local_50 [8];
  String str;
  Fault local_28;
  Fault f;
  Vector<kj::String> *parts_local;
  ArrayPtr<const_char> part_local;
  
  part_local.ptr = (char *)part.size_;
  parts_local = (Vector<kj::String> *)part.ptr;
  f.exception = (Exception *)parts;
  sVar1 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&parts_local);
  if ((sVar1 != 0) &&
     ((sVar1 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&parts_local), sVar1 != 1 ||
      (pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&parts_local,0),
      *pcVar2 != '.')))) {
    sVar1 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&parts_local);
    if ((sVar1 == 2) &&
       ((pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&parts_local,0),
        *pcVar2 == '.' &&
        (pcVar2 = ArrayPtr<const_char>::operator[]((ArrayPtr<const_char> *)&parts_local,1),
        *pcVar2 == '.')))) {
      sVar1 = Vector<kj::String>::size((Vector<kj::String> *)f.exception);
      if (sVar1 == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                  (&local_28,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x13b,FAILED,"parts.size() > 0",
                   "\"can\'t use \\\"..\\\" to break out of starting directory\"",
                   (char (*) [50])"can\'t use \"..\" to break out of starting directory");
        kj::_::Debug::Fault::~Fault(&local_28);
      }
      else {
        Vector<kj::String>::removeLast((Vector<kj::String> *)f.exception);
      }
    }
    else {
      f_1.exception = (Exception *)parts_local;
      value.size_ = in_RCX;
      value.ptr = part_local.ptr;
      heapString((String *)local_50,(kj *)parts_local,value);
      pcVar2 = String::begin((String *)local_50);
      sVar3 = strlen(pcVar2);
      sVar1 = String::size((String *)local_50);
      if (sVar3 != sVar1) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::String&>
                  (&local_70,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x142,FAILED,"strlen(str.begin()) == str.size()",
                   "\"NUL character in path component\", str",
                   (char (*) [32])"NUL character in path component",(String *)local_50);
        pSVar4 = mv<kj::String>((String *)local_50);
        String::String(&local_a0,pSVar4);
        stripNul(&local_88,&local_a0);
        String::operator=((String *)local_50,&local_88);
        String::~String(&local_88);
        String::~String(&local_a0);
        kj::_::Debug::Fault::~Fault(&local_70);
      }
      this.exception = f.exception;
      pSVar4 = mv<kj::String>((String *)local_50);
      Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this.exception,pSVar4);
      String::~String((String *)local_50);
    }
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}